

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O1

void __thiscall
QTextOdfWriter::writeFrameFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextFrameFormat format,int formatIndex)

{
  char16_t *pcVar1;
  ulong uVar2;
  qreal qVar3;
  size_t sVar4;
  bool bVar5;
  QSharedDataPointer<QTextFormatPrivate> this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  undefined4 uVar8;
  undefined4 uVar9;
  QByteArrayView QVar10;
  QAnyStringView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QAnyStringView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QAnyStringView QVar17;
  QByteArrayView QVar18;
  QAnyStringView QVar19;
  QByteArrayView QVar20;
  QAnyStringView QVar21;
  QByteArrayView QVar22;
  QAnyStringView QVar23;
  QByteArrayView QVar24;
  QAnyStringView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  QAnyStringView QVar32;
  QAnyStringView QVar33;
  QAnyStringView QVar34;
  QAnyStringView QVar35;
  QAnyStringView QVar36;
  QAnyStringView QVar37;
  QAnyStringView QVar38;
  QAnyStringView QVar39;
  QAnyStringView QVar40;
  QAnyStringView QVar41;
  QArrayData *local_90 [3];
  QString local_78;
  char16_t *local_60;
  ulong uStack_58;
  QArrayData *local_50;
  size_t local_48;
  ulong local_40;
  long local_38;
  
  this_00 = format.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  QVar10.m_data = &DAT_00000005;
  QVar10.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar10);
  QVar11.m_size = (size_t)pcVar1;
  QVar11.field_0.m_data_utf8 = (char *)writer;
  QVar28.m_size = local_48;
  QVar28.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar11,QVar28);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  QVar12.m_data = (storage_type *)0x4;
  QVar12.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar12);
  sVar4 = local_48;
  aVar6.m_data = (void *)(local_40 | 0x8000000000000000);
  QVar13.m_data = (storage_type *)0x3;
  QVar13.m_size = (qsizetype)local_90;
  QString::fromLatin1(QVar13);
  sVar7 = 0x20;
  QString::arg_impl((longlong)&local_78,(int)local_90,format.super_QTextFormat.format_type,
                    (QChar)0x0);
  local_60 = local_78.d.ptr;
  uStack_58 = local_78.d.size | 0x8000000000000000;
  QVar14.m_size = (size_t)pcVar1;
  QVar14.field_0.m_data_utf8 = (char *)writer;
  QVar29.m_size = sVar4;
  QVar29.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QVar36.m_size = sVar7;
  QVar36.field_0.m_data = aVar6.m_data;
  QXmlStreamWriter::writeAttribute(QVar14,QVar29,QVar36);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_90[0] != (QArrayData *)0x0) {
    LOCK();
    (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90[0],2,0x10);
    }
  }
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  QVar15.m_data = &DAT_00000006;
  QVar15.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar15);
  sVar4 = local_48;
  aVar6.m_data = (void *)(local_40 | 0x8000000000000000);
  QVar16.m_data = (storage_type *)0x7;
  QVar16.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar16);
  QVar17.m_size = (size_t)pcVar1;
  QVar17.field_0.m_data_utf8 = (char *)writer;
  QVar30.m_size = sVar4;
  QVar30.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QVar37.m_size = sVar7;
  QVar37.field_0.m_data = aVar6.m_data;
  QXmlStreamWriter::writeAttribute(QVar17,QVar30,QVar37);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  pcVar1 = (this->styleNS).d.ptr;
  uVar2 = (this->styleNS).d.size;
  QVar18.m_data = (storage_type *)0x12;
  QVar18.m_size = (qsizetype)&local_50;
  QString::fromLatin1(QVar18);
  QVar19.m_size = (size_t)pcVar1;
  QVar19.field_0.m_data_utf8 = (char *)writer;
  QVar31.m_size = local_48;
  QVar31.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar19,QVar31);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4005);
  if (bVar5) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    QVar20.m_data = (storage_type *)0xa;
    QVar20.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar20);
    sVar4 = local_48;
    aVar6.m_data = (void *)(local_40 | 0x8000000000000000);
    qVar3 = QTextFrameFormat::topMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar8 = SUB84(qVar3,0);
    uVar9 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar8 = 0;
      uVar9 = 0;
    }
    pixelToPoint(&local_78,(qreal)CONCAT44(uVar9,uVar8));
    QVar21.m_size = (size_t)pcVar1;
    QVar21.field_0.m_data_utf8 = (char *)writer;
    QVar32.m_size = sVar4;
    QVar32.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar38.m_size = sVar7;
    QVar38.field_0.m_data = aVar6.m_data;
    QXmlStreamWriter::writeAttribute(QVar21,QVar32,QVar38);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4006);
  if (bVar5) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    QVar22.m_data = (storage_type *)0xd;
    QVar22.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar22);
    sVar4 = local_48;
    aVar6.m_data = (void *)(local_40 | 0x8000000000000000);
    qVar3 = QTextFrameFormat::bottomMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar8 = SUB84(qVar3,0);
    uVar9 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar8 = 0;
      uVar9 = 0;
    }
    pixelToPoint(&local_78,(qreal)CONCAT44(uVar9,uVar8));
    QVar23.m_size = (size_t)pcVar1;
    QVar23.field_0.m_data_utf8 = (char *)writer;
    QVar33.m_size = sVar4;
    QVar33.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar39.m_size = sVar7;
    QVar39.field_0.m_data = aVar6.m_data;
    QXmlStreamWriter::writeAttribute(QVar23,QVar33,QVar39);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4007);
  if (bVar5) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    QVar24.m_data = (storage_type *)0xb;
    QVar24.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar24);
    sVar4 = local_48;
    aVar6.m_data = (void *)(local_40 | 0x8000000000000000);
    qVar3 = QTextFrameFormat::leftMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar8 = SUB84(qVar3,0);
    uVar9 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar8 = 0;
      uVar9 = 0;
    }
    pixelToPoint(&local_78,(qreal)CONCAT44(uVar9,uVar8));
    QVar25.m_size = (size_t)pcVar1;
    QVar25.field_0.m_data_utf8 = (char *)writer;
    QVar34.m_size = sVar4;
    QVar34.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar40.m_size = sVar7;
    QVar40.field_0.m_data = aVar6.m_data;
    QXmlStreamWriter::writeAttribute(QVar25,QVar34,QVar40);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x4008);
  if (bVar5) {
    pcVar1 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    QVar26.m_data = (storage_type *)0xc;
    QVar26.m_size = (qsizetype)&local_50;
    QString::fromLatin1(QVar26);
    qVar3 = QTextFrameFormat::rightMargin((QTextFrameFormat *)this_00.d.ptr);
    uVar8 = SUB84(qVar3,0);
    uVar9 = (undefined4)((ulong)qVar3 >> 0x20);
    if (qVar3 <= 0.0) {
      uVar8 = 0;
      uVar9 = 0;
    }
    pixelToPoint(&local_78,(qreal)CONCAT44(uVar9,uVar8));
    QVar27.m_size = (size_t)pcVar1;
    QVar27.field_0.m_data_utf8 = (char *)writer;
    QVar35.m_size = local_48;
    QVar35.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar41.m_size = sVar7;
    QVar41.field_0.m_data = (void *)(local_40 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar27,QVar35,QVar41);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeFrameFormat(QXmlStreamWriter &writer, QTextFrameFormat format, int formatIndex) const
{
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("s%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("section"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("section-properties"));
    if (format.hasProperty(QTextFormat::FrameTopMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-top"), pixelToPoint(qMax(qreal(0.), format.topMargin())) );
    if (format.hasProperty(QTextFormat::FrameBottomMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-bottom"), pixelToPoint(qMax(qreal(0.), format.bottomMargin())) );
    if (format.hasProperty(QTextFormat::FrameLeftMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-left"), pixelToPoint(qMax(qreal(0.), format.leftMargin())) );
    if (format.hasProperty(QTextFormat::FrameRightMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-right"), pixelToPoint(qMax(qreal(0.), format.rightMargin())) );

    writer.writeEndElement(); // style

// TODO consider putting the following properties in a qt-namespace.
// Position   position () const
// qreal   border () const
// QBrush   borderBrush () const
// BorderStyle   borderStyle () const
// qreal   padding () const
// QTextLength   width () const
// QTextLength   height () const
// PageBreakFlags   pageBreakPolicy () const
}